

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O0

NumericConstantChar NumericConstantChars::getChar(char c)

{
  NumericConstantChar local_9;
  char c_local;
  
  switch(c) {
  case '+':
    local_9 = PlusSign;
    break;
  default:
    local_9 = Zero;
    break;
  case '-':
    local_9 = MinusSign;
    break;
  case '.':
    local_9 = DecimalPoint;
    break;
  case '0':
    local_9 = Zero;
    break;
  case '1':
    local_9 = One;
    break;
  case '2':
    local_9 = Two;
    break;
  case '3':
    local_9 = Three;
    break;
  case '4':
    local_9 = Four;
    break;
  case '5':
    local_9 = Five;
    break;
  case '6':
    local_9 = Six;
    break;
  case '7':
    local_9 = Seven;
    break;
  case '8':
    local_9 = Eight;
    break;
  case '9':
    local_9 = Nine;
    break;
  case 'a':
    local_9 = A;
    break;
  case 'b':
    local_9 = B;
    break;
  case 'c':
    local_9 = C;
    break;
  case 'd':
    local_9 = D;
    break;
  case 'e':
    local_9 = E;
    break;
  case 'f':
    local_9 = F;
    break;
  case 'i':
    local_9 = ImaginaryUnit;
  }
  return local_9;
}

Assistant:

NumericConstantChar NumericConstantChars::getChar(char c) {
	switch (c) {
		case '0':
			return NumericConstantChar::Zero;
		case '1':
			return NumericConstantChar::One;
		case '2':
			return NumericConstantChar::Two;
		case '3':
			return NumericConstantChar::Three;
		case '4':
			return NumericConstantChar::Four;
		case '5':
			return NumericConstantChar::Five;
		case '6':
			return NumericConstantChar::Six;
		case '7':
			return NumericConstantChar::Seven;
		case '8':
			return NumericConstantChar::Eight;
		case '9':
			return NumericConstantChar::Nine;
		case 'a':
			return NumericConstantChar::A;
		case 'b':
			return NumericConstantChar::B;
		case 'c':
			return NumericConstantChar::C;
		case 'd':
			return NumericConstantChar::D;
		case 'e':
			return NumericConstantChar::E;
		case 'f':
			return NumericConstantChar::F;
		case '-':
			return NumericConstantChar::MinusSign;
		case '+':
			return NumericConstantChar::PlusSign;
		case '.':
			return NumericConstantChar::DecimalPoint;
		case 'i':
			return NumericConstantChar::ImaginaryUnit;
		default:
			return NumericConstantChar::Zero;
	}
}